

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.h
# Opt level: O3

int __thiscall
CVmImageFileStream::clone
          (CVmImageFileStream *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  
  iVar2 = (*this->fp_->_vptr_CVmImageFile[2])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)operator_new(0x18);
    sVar1 = this->len_;
    *puVar3 = &PTR__CVmStream_00366458;
    puVar3[1] = CONCAT44(extraout_var,iVar2);
    puVar3[2] = sVar1;
  }
  return (int)puVar3;
}

Assistant:

CVmStream *clone(VMG_ const char *mode)
    {
        /* duplicate our file handle */
        CVmImageFile *fpdup = fp_->dup(mode);
        if (fpdup == 0)
            return 0;

        /* create a new image file stream wrapper for the duplicate handle */
        return new CVmImageFileStream(fpdup, len_);
    }